

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::Parse(Parser *this)

{
  byte bVar1;
  byte *pbVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  byte *pbVar8;
  pointer pMVar9;
  int iVar10;
  uint fmt;
  string local_340;
  vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_> *local_320;
  vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_> *local_318;
  vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_> *local_310;
  vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_> *local_308;
  undefined1 local_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [20];
  undefined4 local_1ac;
  ai_real aStack_1a8;
  ai_real aStack_1a4;
  ai_real aStack_1a0;
  ai_real aStack_19c;
  pointer local_198;
  
  local_308 = &this->m_vMeshes;
  local_310 = &this->m_vDummies;
  local_318 = &this->m_vLights;
  local_320 = &this->m_vCameras;
  iVar10 = 0;
LAB_003fef46:
  while( true ) {
    pbVar2 = (byte *)this->filePtr;
    bVar1 = *pbVar2;
    if (bVar1 < 0x7b) break;
    if (bVar1 == 0x7b) {
      iVar10 = iVar10 + 1;
    }
    else if ((bVar1 == 0x7d) && (iVar10 = iVar10 + -1, iVar10 == 0)) {
      this->filePtr = (char *)(pbVar2 + 1);
      SkipToNextToken(this);
      return;
    }
LAB_003ff0b9:
    bVar4 = false;
    uVar7 = (uint)(byte)*this->filePtr;
    if ((uVar7 < 0xe) && ((0x3401U >> (uVar7 & 0x1f) & 1) != 0)) {
      if (this->bLastWasEndLine == false) {
        this->iLineNumber = this->iLineNumber + 1;
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
    }
    this->bLastWasEndLine = bVar4;
    this->filePtr = this->filePtr + 1;
  }
  if (bVar1 != 0x2a) {
    if (bVar1 == 0) {
      return;
    }
    goto LAB_003ff0b9;
  }
  pbVar8 = pbVar2 + 1;
  this->filePtr = (char *)pbVar8;
  iVar5 = strncmp("3DSMAX_ASCIIEXPORT",(char *)pbVar8,0x12);
  if (iVar5 == 0) {
    bVar1 = pbVar2[0x13];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_003fef9e;
    pbVar8 = pbVar2 + 0x14;
    if (bVar1 == 0) {
      pbVar8 = pbVar2 + 0x13;
    }
    this->filePtr = (char *)pbVar8;
    ParseLV4MeshLong(this,(uint *)local_300);
    uVar3 = local_300._0_4_;
    if ((uint)local_300._0_4_ < 0xc9) goto LAB_003ff1b1;
    LogWarning(this,
               "Unknown file format version: *3DSMAX_ASCIIEXPORT should                                be <= 200"
              );
    goto LAB_003ff1b9;
  }
LAB_003fef9e:
  iVar5 = strncmp("SCENE",(char *)pbVar8,5);
  if (iVar5 == 0) {
    bVar1 = pbVar2[6];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 7;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 6;
      }
      this->filePtr = (char *)pbVar8;
      ParseLV1SceneBlock(this);
      goto LAB_003fef46;
    }
  }
  iVar5 = strncmp("GROUP",(char *)pbVar8,5);
  if (iVar5 == 0) {
    bVar1 = pbVar2[6];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 7;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 6;
      }
      this->filePtr = (char *)pbVar8;
      Parse(this);
      goto LAB_003fef46;
    }
  }
  iVar5 = strncmp("MATERIAL_LIST",(char *)pbVar8,0xd);
  if (iVar5 == 0) {
    bVar1 = pbVar2[0xe];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 0xf;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 0xe;
      }
      this->filePtr = (char *)pbVar8;
      ParseLV1MaterialListBlock(this);
      goto LAB_003fef46;
    }
  }
  iVar5 = strncmp("GEOMOBJECT",(char *)pbVar8,10);
  if (iVar5 == 0) {
    bVar1 = pbVar2[0xb];
    if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
    goto LAB_003ff00e;
    pbVar8 = pbVar2 + 0xc;
    if (bVar1 == 0) {
      pbVar8 = pbVar2 + 0xb;
    }
    this->filePtr = (char *)pbVar8;
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"UNNAMED","");
    Mesh::Mesh((Mesh *)local_300,&local_340);
    std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::
    emplace_back<Assimp::ASE::Mesh>(local_308,(Mesh *)local_300);
    Mesh::~Mesh((Mesh *)local_300);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    pMVar9 = (this->m_vMeshes).
             super__Vector_base<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar6 = -0x288;
LAB_003ff47e:
    ParseLV1ObjectBlock(this,(BaseNode *)
                             ((long)&(pMVar9->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).
                                     mPositions.
                                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar6));
    goto LAB_003fef46;
  }
LAB_003ff00e:
  iVar5 = strncmp("HELPEROBJECT",(char *)pbVar8,0xc);
  if (iVar5 == 0) {
    bVar1 = pbVar2[0xd];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 0xe;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 0xd;
      }
      this->filePtr = (char *)pbVar8;
      Dummy::Dummy((Dummy *)local_300);
      std::vector<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>::
      emplace_back<Assimp::ASE::Dummy>(local_310,(Dummy *)local_300);
      BaseNode::~BaseNode((BaseNode *)local_300);
      pMVar9 = (pointer)(this->m_vDummies).
                        super__Vector_base<Assimp::ASE::Dummy,_std::allocator<Assimp::ASE::Dummy>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      lVar6 = -0x158;
      goto LAB_003ff47e;
    }
  }
  iVar5 = strncmp("LIGHTOBJECT",(char *)pbVar8,0xb);
  if (iVar5 == 0) {
    bVar1 = pbVar2[0xc];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 0xd;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 0xc;
      }
      this->filePtr = (char *)pbVar8;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"UNNAMED","");
      BaseNode::BaseNode((BaseNode *)local_300,Light,&local_340);
      local_1ac = 0;
      aStack_1a8 = 1.0;
      aStack_1a4 = 1.0;
      aStack_1a0 = 1.0;
      aStack_19c = 1.0;
      local_198 = (pointer)0x42340000;
      std::vector<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>::
      emplace_back<Assimp::ASE::Light>(local_318,(Light *)local_300);
      BaseNode::~BaseNode((BaseNode *)local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      pMVar9 = (pointer)(this->m_vLights).
                        super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      lVar6 = -0x170;
      goto LAB_003ff47e;
    }
  }
  iVar5 = strncmp("CAMERAOBJECT",(char *)pbVar8,0xc);
  if (iVar5 == 0) {
    bVar1 = pbVar2[0xd];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 0xe;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 0xd;
      }
      this->filePtr = (char *)pbVar8;
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"UNNAMED","");
      BaseNode::BaseNode((BaseNode *)local_300,Camera,&local_340);
      local_1ac = 0x3f400000;
      aStack_1a8 = 0.1;
      aStack_1a4 = 1000.0;
      aStack_1a0 = 0.0;
      std::vector<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>::
      emplace_back<Assimp::ASE::Camera>(local_320,(Camera *)local_300);
      BaseNode::~BaseNode((BaseNode *)local_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      pMVar9 = (pointer)(this->m_vCameras).
                        super__Vector_base<Assimp::ASE::Camera,_std::allocator<Assimp::ASE::Camera>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = -0x168;
      goto LAB_003ff47e;
    }
  }
  iVar5 = strncmp("COMMENT",(char *)pbVar8,7);
  if (iVar5 == 0) {
    bVar1 = pbVar2[8];
    if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      pbVar8 = pbVar2 + 9;
      if (bVar1 == 0) {
        pbVar8 = pbVar2 + 8;
      }
      this->filePtr = (char *)pbVar8;
      local_300._0_8_ = local_300 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"<unknown>","");
      ParseString(this,(string *)local_300,"*COMMENT");
      std::operator+(&local_340,"Comment: ",(string *)local_300);
      LogInfo(this,local_340._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_300._0_8_ != (pointer)(local_300 + 0x10)) {
        operator_delete((void *)local_300._0_8_,(ulong)(local_2f0[0]._M_allocated_capacity + 1));
      }
      goto LAB_003fef46;
    }
  }
  if ((this->iFileFormat < 200) &&
     (bVar4 = TokenMatch<char_const>(&this->filePtr,"MESH_SOFTSKINVERTS",0x12), bVar4)) {
    ParseLV1SoftSkinBlock(this);
  }
  goto LAB_003ff0b9;
LAB_003ff1b1:
  if (local_300._0_4_ != Light) {
LAB_003ff1b9:
    this->iFileFormat = uVar3;
  }
  goto LAB_003fef46;
}

Assistant:

void Parser::Parse()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Version should be 200. Validate this ...
            if (TokenMatch(filePtr,"3DSMAX_ASCIIEXPORT",18))
            {
                unsigned int fmt;
                ParseLV4MeshLong(fmt);

                if (fmt > 200)
                {
                    LogWarning("Unknown file format version: *3DSMAX_ASCIIEXPORT should \
                               be <= 200");
                }
                // *************************************************************
                // - fmt will be 0 if we're unable to read the version number
                // there are some faulty files without a version number ...
                // in this case we'll guess the exact file format by looking
                // at the file extension (ASE, ASK, ASC)
                // *************************************************************

                if ( fmt ) {
                    iFileFormat = fmt;
                }
                continue;
            }
            // main scene information
            if (TokenMatch(filePtr,"SCENE",5))
            {
                ParseLV1SceneBlock();
                continue;
            }
            // "group" - no implementation yet, in facte
            // we're just ignoring them for the moment
            if (TokenMatch(filePtr,"GROUP",5))
            {
                Parse();
                continue;
            }
            // material list
            if (TokenMatch(filePtr,"MATERIAL_LIST",13))
            {
                ParseLV1MaterialListBlock();
                continue;
            }
            // geometric object (mesh)
            if (TokenMatch(filePtr,"GEOMOBJECT",10))

            {
                m_vMeshes.push_back(Mesh("UNNAMED"));
                ParseLV1ObjectBlock(m_vMeshes.back());
                continue;
            }
            // helper object = dummy in the hierarchy
            if (TokenMatch(filePtr,"HELPEROBJECT",12))

            {
                m_vDummies.push_back(Dummy());
                ParseLV1ObjectBlock(m_vDummies.back());
                continue;
            }
            // light object
            if (TokenMatch(filePtr,"LIGHTOBJECT",11))

            {
                m_vLights.push_back(Light("UNNAMED"));
                ParseLV1ObjectBlock(m_vLights.back());
                continue;
            }
            // camera object
            if (TokenMatch(filePtr,"CAMERAOBJECT",12))
            {
                m_vCameras.push_back(Camera("UNNAMED"));
                ParseLV1ObjectBlock(m_vCameras.back());
                continue;
            }
            // comment - print it on the console
            if (TokenMatch(filePtr,"COMMENT",7))
            {
                std::string out = "<unknown>";
                ParseString(out,"*COMMENT");
                LogInfo(("Comment: " + out).c_str());
                continue;
            }
            // ASC bone weights
            if (AI_ASE_IS_OLD_FILE_FORMAT() && TokenMatch(filePtr,"MESH_SOFTSKINVERTS",18))
            {
                ParseLV1SoftSkinBlock();
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}